

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O3

int __thiscall flow::lang::Lexer::nextChar(Lexer *this,bool interscope)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  iterator __position;
  int iVar3;
  int iVar4;
  
  iVar4 = -1;
  if (this->currentChar_ != -1) {
    p_Var1 = (this->contexts_).
             super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    p_Var2 = p_Var1[1]._M_next;
    *(_List_node_base **)&(this->location_).end = *(_List_node_base **)((long)(p_Var2 + 4) + 8);
    (this->location_).end.offset = *(uint *)&p_Var2[5]._M_next;
    p_Var1 = p_Var1[1]._M_next;
    *(undefined4 *)&p_Var1[5]._M_next = *(undefined4 *)((long)(p_Var1 + 5) + 0xc);
    *(_List_node_base **)((long)(p_Var1 + 4) + 8) = *(_List_node_base **)((long)(p_Var1 + 5) + 4);
    iVar3 = std::istream::get();
    if (iVar3 == -1) {
      this->currentChar_ = -1;
      if ((interscope) &&
         (1 < (this->contexts_).
              super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
              ._M_impl._M_node._M_size)) {
        __position._M_node =
             (this->contexts_).
             super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
        this->currentChar_ = *(int *)&__position._M_node[1]._M_next[6]._M_next;
        std::__cxx11::
        list<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
        ::_M_erase(&this->contexts_,__position);
        iVar4 = this->currentChar_;
      }
    }
    else {
      this->currentChar_ = iVar3;
      p_Var1 = (this->contexts_).
               super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
      *(int *)((long)(p_Var1 + 5) + 0xcU) = *(int *)((long)(p_Var1 + 5) + 0xcU) + 1;
      if (iVar3 == 10) {
        *(undefined4 *)((long)(p_Var1 + 5) + 8) = 1;
        *(int *)((long)(p_Var1 + 5) + 4U) = *(int *)((long)(p_Var1 + 5) + 4U) + 1;
        iVar4 = 10;
      }
      else {
        *(int *)((long)(p_Var1 + 5) + 8U) = *(int *)((long)(p_Var1 + 5) + 8U) + 1;
        iVar4 = iVar3;
      }
    }
  }
  return iVar4;
}

Assistant:

int Lexer::nextChar(bool interscope) {
  if (currentChar_ == EOF) return currentChar_;

  location_.end = scope()->currPos;
  scope()->currPos = scope()->nextPos;

  int ch = scope()->stream->get();
  if (ch == EOF) {
    currentChar_ = ch;

    if (interscope && contexts_.size() > 1) {
      leaveScope();
    }
    return currentChar_;
  }

  currentChar_ = ch;
  // content_ += static_cast<char>(currentChar_);
  scope()->nextPos.offset++;

  if (currentChar_ != '\n') {
    scope()->nextPos.column++;
  } else {
    scope()->nextPos.column = 1;
    scope()->nextPos.line++;
  }

  return currentChar_;
}